

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O2

_Bool xdr_dplx_decode(XDR *xdrs,rpc_msg *dmsg)

{
  uint uVar1;
  _Bool _Var2;
  msg_type mVar3;
  uint *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  puVar4 = (uint *)xdrs->x_data;
  if (((xdrs->x_v).vio_tail < puVar4 + 5) ||
     (xdrs->x_data = (uint8_t *)(puVar4 + 5), puVar4 == (uint *)0x0)) {
    _Var2 = xdr_getuint32(xdrs,&dmsg->rm_xid);
    if (_Var2) {
      _Var2 = xdr_getuint32(xdrs,&dmsg->rm_direction);
      if (_Var2) {
        mVar3 = dmsg->rm_direction;
        puVar4 = (uint *)0x0;
        goto LAB_00110896;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR rm_direction";
      uVar5 = 0x1c3;
    }
    else {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar6 = "%s:%u ERROR rm_xid";
      uVar5 = 0x1bd;
    }
    (*__ntirpc_pkg_params.warnx_)(pcVar6,"xdr_dplx_decode",uVar5);
  }
  else {
    uVar1 = *puVar4;
    dmsg->rm_xid = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = puVar4[1];
    puVar4 = puVar4 + 2;
    mVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    dmsg->rm_direction = mVar3;
LAB_00110896:
    if (mVar3 == REPLY) {
      _Var2 = xdr_reply_decode(xdrs,dmsg,(int32_t *)puVar4);
      return _Var2;
    }
    if (mVar3 == CALL) {
      _Var2 = xdr_call_decode(xdrs,dmsg,(int32_t *)puVar4);
      return _Var2;
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR dmsg->rm_direction (%u)","xdr_dplx_decode",0x1d0);
    }
  }
  return false;
}

Assistant:

bool
xdr_dplx_decode(XDR *xdrs, struct rpc_msg *dmsg)
{
	int32_t *buf;

	/*
	 * NOTE: 5 here, 3 more in each _decode
	 */
	buf = xdr_inline_decode(xdrs, 5 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		dmsg->rm_xid = IXDR_GET_U_INT32(buf);
		dmsg->rm_direction = IXDR_GET_ENUM(buf, enum msg_type);
	} else {
		if (!xdr_getuint32(xdrs, &(dmsg->rm_xid))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_direction))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_direction) {
	case CALL:
		return (xdr_call_decode(xdrs, dmsg, buf));
	case REPLY:
		return (xdr_reply_decode(xdrs, dmsg, buf));
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_direction (%u)",
			__func__, __LINE__,
			dmsg->rm_direction);
		break;
	};

	return (false);
}